

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * String::fromBase64(String *__return_storage_ptr__,String *data)

{
  byte bVar1;
  byte bVar2;
  ulong size;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  usize length;
  char cVar6;
  String result;
  String local_50;
  
  local_50.data = &emptyData.super_Data;
  size = data->data->len;
  if ((size & 3) == 0) {
    reserve(&local_50,size);
    pcVar3 = operator_cast_to_char_(&local_50);
    pcVar4 = operator_cast_to_char_(data);
    length = 0;
    for (uVar5 = 0; size != uVar5; uVar5 = uVar5 + 1) {
      bVar1 = pcVar4[uVar5];
      if ('z' < (char)bVar1) goto LAB_00109091;
      bVar2 = (&DAT_0010a610)[bVar1];
      if (bVar2 == 0xff) {
        if (bVar1 != 0x3d) goto LAB_00109091;
        break;
      }
      switch((uint)uVar5 & 3) {
      case 0:
        pcVar3[length] = bVar2 << 2;
        break;
      case 1:
        pcVar3[length] = pcVar3[length] | bVar2 >> 4 & 3;
        cVar6 = bVar2 << 4;
        goto LAB_0010914c;
      case 2:
        pcVar3[length] = pcVar3[length] | bVar2 >> 2 & 0xf;
        cVar6 = bVar2 << 6;
LAB_0010914c:
        pcVar3[length + 1] = cVar6;
        length = length + 1;
        break;
      case 3:
        pcVar3[length] = pcVar3[length] | bVar2;
        length = length + 1;
      }
    }
    resize(&local_50,length);
    String(__return_storage_ptr__,&local_50);
  }
  else {
LAB_00109091:
    __return_storage_ptr__->data = &emptyData.super_Data;
  }
  ~String(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String String::fromBase64(const String& data)
{
    String result;
    usize inlen = data.length();
    if (inlen & 0x3)
        return String();
    result.reserve(data.length());
    char* out = (char*)result;
    const char* in = (const char*)data;
    usize i;
    usize j;
    unsigned char c;
    const unsigned char base64de[] = {
        /* nul, soh, stx, etx, eot, enq, ack, bel, */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /*  bs,  ht,  nl,  vt,  np,  cr,  so,  si, */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /* dle, dc1, dc2, dc3, dc4, nak, syn, etb, */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /* can,  em, sub, esc,  fs,  gs,  rs,  us, */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /*  sp, '!', '"', '#', '$', '%', '&', ''', */
           255, 255, 255, 255, 255, 255, 255, 255,
    
        /* '(', ')', '*', '+', ',', '-', '.', '/', */
           255, 255, 255,  62, 255, 255, 255,  63,
    
        /* '0', '1', '2', '3', '4', '5', '6', '7', */
            52,  53,  54,  55,  56,  57,  58,  59,
    
        /* '8', '9', ':', ';', '<', '=', '>', '?', */
            60,  61, 255, 255, 255, 255, 255, 255,
    
        /* '@', 'A', 'B', 'C', 'D', 'E', 'F', 'G', */
           255,   0,   1,  2,   3,   4,   5,    6,
    
        /* 'H', 'I', 'J', 'K', 'L', 'M', 'N', 'O', */
             7,   8,   9,  10,  11,  12,  13,  14,
    
        /* 'P', 'Q', 'R', 'S', 'T', 'U', 'V', 'W', */
            15,  16,  17,  18,  19,  20,  21,  22,
    
        /* 'X', 'Y', 'Z', '[', '\', ']', '^', '_', */
            23,  24,  25, 255, 255, 255, 255, 255,
    
        /* '`', 'a', 'b', 'c', 'd', 'e', 'f', 'g', */
           255,  26,  27,  28,  29,  30,  31,  32,
    
        /* 'h', 'i', 'j', 'k', 'l', 'm', 'n', 'o', */
            33,  34,  35,  36,  37,  38,  39,  40,
    
        /* 'p', 'q', 'r', 's', 't', 'u', 'v', 'w', */
            41,  42,  43,  44,  45,  46,  47,  48,
    
        /* 'x', 'y', 'z', '{', '|', '}', '~', del, */
            49,  50,  51//, 255, 255, 255, 255, 255
    };
    for (i = j = 0; i < inlen; ++i)
    {
        if (in[i] > 'z') 
            return String();

        c = base64de[(unsigned char)in[i]];
        if (c == 255)
        {
            if (in[i] == '=')
                break;

            return String();
        }

        switch (i & 0x3)
        {
        case 0:
            out[j] = (c << 2) & 0xFF;
            break;
        case 1:
            out[j++] |= (c >> 4) & 0x3;
            out[j] = (c & 0xF) << 4; 
            break;
        case 2:
            out[j++] |= (c >> 2) & 0xF;
            out[j] = (c & 0x3) << 6;
            break;
        case 3:
            out[j++] |= c;
            break;
        }
    }
    result.resize(j);
    return result;
}